

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O0

int yylex_destroy(void)

{
  YY_BUFFER_STATE b;
  YY_BUFFER_STATE local_8;
  
  while( true ) {
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_8 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_8 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (local_8 == (YY_BUFFER_STATE)0x0) break;
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      b = (YY_BUFFER_STATE)0x0;
    }
    else {
      b = yy_buffer_stack[yy_buffer_stack_top];
    }
    yy_delete_buffer(b);
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    yypop_buffer_state();
  }
  yyfree((void *)0x16e69f);
  yy_buffer_stack = (YY_BUFFER_STATE *)0x0;
  yy_init_globals();
  return 0;
}

Assistant:

int yylex_destroy  (void)
{
    
    /* Pop the buffer stack, destroying each element. */
	while(YY_CURRENT_BUFFER){
		yy_delete_buffer( YY_CURRENT_BUFFER  );
		YY_CURRENT_BUFFER_LVALUE = NULL;
		yypop_buffer_state();
	}

	/* Destroy the stack itself. */
	yyfree((yy_buffer_stack) );
	(yy_buffer_stack) = NULL;

    /* Reset the globals. This is important in a non-reentrant scanner so the next time
     * yylex() is called, initialization will occur. */
    yy_init_globals( );

    return 0;
}